

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricAlgorithm.cpp
# Opt level: O3

bool __thiscall
AsymmetricAlgorithm::verifyInit
          (AsymmetricAlgorithm *this,PublicKey *publicKey,Type mechanism,void *param_3,
          size_t param_4)

{
  bool bVar1;
  
  bVar1 = this->currentOperation == NONE;
  if (publicKey != (PublicKey *)0x0 && bVar1) {
    this->currentOperation = VERIFY;
    this->currentPublicKey = publicKey;
    this->currentMechanism = mechanism;
  }
  return publicKey != (PublicKey *)0x0 && bVar1;
}

Assistant:

bool AsymmetricAlgorithm::verifyInit(PublicKey* publicKey, const AsymMech::Type mechanism,
				     const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if ((currentOperation != NONE) || (publicKey == NULL))
	{
		return false;
	}

	currentOperation = VERIFY;
	currentPublicKey = publicKey;
	currentMechanism = mechanism;

	return true;
}